

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

void llvm::sys::path::append
               (SmallVectorImpl<char> *path,const_iterator begin,const_iterator end,Style style)

{
  Style style_00;
  SmallVectorImpl<char> *path_00;
  bool bVar1;
  reference Str;
  Twine local_78;
  Twine local_60;
  Twine local_48;
  Twine local_30;
  Style local_14;
  SmallVectorImpl<char> *pSStack_10;
  Style style_local;
  SmallVectorImpl<char> *path_local;
  
  local_14 = style;
  pSStack_10 = path;
  while( true ) {
    bVar1 = iterator_facade_base<llvm::sys::path::const_iterator,_std::input_iterator_tag,_const_llvm::StringRef,_long,_const_llvm::StringRef_*,_const_llvm::StringRef_&>
            ::operator!=((iterator_facade_base<llvm::sys::path::const_iterator,_std::input_iterator_tag,_const_llvm::StringRef,_long,_const_llvm::StringRef_*,_const_llvm::StringRef_&>
                          *)&begin,&end);
    path_00 = pSStack_10;
    style_00 = local_14;
    if (!bVar1) break;
    Str = const_iterator::operator*(&begin);
    Twine::Twine(&local_30,Str);
    Twine::Twine(&local_48,"");
    Twine::Twine(&local_60,"");
    Twine::Twine(&local_78,"");
    append(path_00,style_00,&local_30,&local_48,&local_60,&local_78);
    const_iterator::operator++(&begin);
  }
  return;
}

Assistant:

void append(SmallVectorImpl<char> &path, const_iterator begin,
            const_iterator end, Style style) {
  for (; begin != end; ++begin)
    path::append(path, style, *begin);
}